

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leakagemodel.cpp
# Opt level: O0

double __thiscall
FavadLeakageModel::findFlow
          (FavadLeakageModel *this,double a,double m,double length,double h,double *dqdh)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double q2;
  double q1;
  double *dqdh_local;
  double h_local;
  double length_local;
  double m_local;
  double a_local;
  FavadLeakageModel *this_local;
  
  if (0.0 < h) {
    dVar1 = (a / (this->super_LeakageModel).lengthUcf) * C;
    dVar2 = pow(h,0.5);
    dVar1 = (dVar1 * dVar2 * length) / 1000.0;
    dVar2 = m * C;
    dVar3 = pow(h,1.5);
    dVar2 = (dVar2 * dVar3 * length) / 1000.0;
    *dqdh = ((dVar1 * 0.5 + dVar2 * 1.5) / h) / 2.0;
    this_local = (FavadLeakageModel *)(dVar1 + dVar2);
  }
  else {
    *dqdh = 0.0;
    this_local = (FavadLeakageModel *)0x0;
  }
  return (double)this_local;
}

Assistant:

double FavadLeakageModel::findFlow(double a, double m, double length, double h,
                                   double& dqdh)
{
    // no leakage for non-positive pressure head
    if ( h <= 0.0 )
    {
        dqdh = 0.0;
        return 0.0;
    }

    // 'a' is leak area per 1000 pipe length units,
    // 'm' is change in 'a' per change in head (dimensionless),
    // convert 'a' to ft2 / 1000 ft
    a /= lengthUcf;

    // compute fixed & variable head portions of leakage in cfs
    // (C is orifice constant, 0.6 * sqrt(2g))
    double q1 = a * C * pow(h, 0.5) * length / 1000.0;
    double q2 = m * C * pow(h, 1.5) * length / 1000.0;

    // find half-gradient of leakage flow
    dqdh = (0.5 * q1 + 1.5 * q2) / h / 2.0;

    // return total leakage flow rate
    return q1 + q2;
}